

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewParserCtxt(char *URL)

{
  xmlChar *pxVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlRelaxNGParserCtxtPtr ret;
  char *URL_local;
  
  if (URL == (char *)0x0) {
    URL_local = (char *)0x0;
  }
  else {
    URL_local = (char *)(*xmlMalloc)(0x100);
    if (URL_local == (char *)0x0) {
      xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)0x0,"building parser\n");
      URL_local = (char *)0x0;
    }
    else {
      memset(URL_local,0,0x100);
      pxVar1 = xmlStrdup((xmlChar *)URL);
      *(xmlChar **)(URL_local + 0x80) = pxVar1;
      pp_Var2 = __xmlGenericError();
      *(xmlGenericErrorFunc *)(URL_local + 8) = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      *(void **)URL_local = *ppvVar3;
    }
  }
  return (xmlRelaxNGParserCtxtPtr)URL_local;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewParserCtxt(const char *URL)
{
    xmlRelaxNGParserCtxtPtr ret;

    if (URL == NULL)
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL, "building parser\n");
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->URL = xmlStrdup((const xmlChar *) URL);
    ret->error = xmlGenericError;
    ret->userData = xmlGenericErrorContext;
    return (ret);
}